

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtGStateRegistry.cpp
# Opt level: O2

ObjectIDTypeAndBool __thiscall
ExtGStateRegistry::RegisterExtGStateForOpacity(ExtGStateRegistry *this,double inAlphaValue)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  IndirectObjectsReferenceRegistry *this_00;
  undefined8 uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_bool> pVar4;
  ObjectIDTypeAndBool OVar5;
  double local_28;
  pair<const_double,_unsigned_long> local_20;
  
  if (this->mObjectsContext == (ObjectsContext *)0x0) {
    p_Var2 = (_Base_ptr)0x0;
    uVar3 = 0;
  }
  else {
    local_28 = inAlphaValue;
    iVar1 = std::
            _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
            ::find(&(this->mAlphaExtGstates)._M_t,&local_28);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->mAlphaExtGstates)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
      local_20.second = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
      local_20.first = local_28;
      pVar4 = std::
              _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
              ::_M_insert_unique<std::pair<double_const,unsigned_long>>
                        ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                          *)&this->mAlphaExtGstates,&local_20);
      iVar1._M_node = (_Base_ptr)pVar4.first._M_node;
      uVar3 = CONCAT71(pVar4._9_7_,1);
    }
    else {
      uVar3 = 0;
    }
    p_Var2 = iVar1._M_node[1]._M_parent;
  }
  OVar5._8_8_ = uVar3;
  OVar5.first = (unsigned_long)p_Var2;
  return OVar5;
}

Assistant:

ObjectIDTypeAndBool ExtGStateRegistry::RegisterExtGStateForOpacity(double inAlphaValue) {
    if(!mObjectsContext)
        return ObjectIDTypeAndBool(0,false);

    DoubleToObjectIDTypeMap::iterator it = mAlphaExtGstates.find(inAlphaValue);

    if(it == mAlphaExtGstates.end()) {
        ObjectIDType objectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
        it = mAlphaExtGstates.insert(DoubleToObjectIDTypeMap::value_type(inAlphaValue,objectId)).first;
        return ObjectIDTypeAndBool(it->second,true);
    }

    return ObjectIDTypeAndBool(it->second, false);
}